

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuPixelFormat.hpp
# Opt level: O2

int tcu::PixelFormat::convertChannel(int val,int bits)

{
  int iVar1;
  byte bVar2;
  
  if (bits == 1) {
    return (uint)(int)(char)val >> 7 & 0xff;
  }
  bVar2 = 8 - (char)bits;
  iVar1 = val >> (bVar2 & 0x1f);
  return iVar1 >> ((char)bits * '\x02' - 8U & 0x1f) | iVar1 << (bVar2 & 0x1f);
}

Assistant:

static inline int convertChannel (int val, int bits)
	{
		if (bits == 1)
			return (val & 0x80) ? 0xff : 0;
		else
		{
			DE_ASSERT(deInRange32(bits, 4, 8));
			int c = val >> (8-bits);
			return (c << (8-bits)) | (c >> (2*bits-8));
		}
	}